

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MosquitoNet.h
# Opt level: O0

Stats * __thiscall
Enhedron::Test::Impl::Impl_Suite::
Runner<Enhedron::Test::Impl::Impl_Suite::RunTest<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/LeviTaule[P]exma2D/tests/VectorTest.hpp:139:30)>_>
::run(Stats *__return_storage_ptr__,
     Runner<Enhedron::Test::Impl::Impl_Suite::RunTest<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_VectorTest_hpp:139:30)>_>
     *this,PathList *pathList,Out<Enhedron::Test::Impl::Impl_Suite::ContextResultsRecorder> results,
     size_t depth)

{
  Stats rhs;
  bool bVar1;
  ContextResultsRecorder *pCVar2;
  Stats local_50;
  size_t local_28;
  size_t depth_local;
  PathList *pathList_local;
  Runner<Enhedron::Test::Impl::Impl_Suite::RunTest<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_VectorTest_hpp:139:30)>_>
  *this_local;
  Out<Enhedron::Test::Impl::Impl_Suite::ContextResultsRecorder> results_local;
  
  local_28 = depth;
  depth_local = (size_t)pathList;
  pathList_local = (PathList *)this;
  this_local = (Runner<Enhedron::Test::Impl::Impl_Suite::RunTest<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_VectorTest_hpp:139:30)>_>
                *)results.value;
  pCVar2 = Enhedron::Impl::Util::Out<Enhedron::Test::Impl::Impl_Suite::ContextResultsRecorder>::
           operator->((Out<Enhedron::Test::Impl::Impl_Suite::ContextResultsRecorder> *)&this_local);
  ContextResultsRecorder::beginGiven(pCVar2,&this->name);
  Impl_Results::Stats::Stats(__return_storage_ptr__);
  bVar1 = included(this,(PathList *)depth_local,local_28);
  if (bVar1) {
    Util::Impl::Impl_MetaProgramming::StoreArgs<>::
    applyExtraBefore<Enhedron::Test::Impl::Impl_Suite::RunTest<__3>&,std::__cxx11::string&,Enhedron::Impl::Util::Out<Enhedron::Test::Impl::Impl_Suite::ContextResultsRecorder>&>
              (&local_50,(StoreArgs<> *)&this->field_0x29,
               (RunTest<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_LeviTaule[P]exma2D_tests_VectorTest_hpp:139:30)>
                *)&this->field_0x28,&this->name,
               (Out<Enhedron::Test::Impl::Impl_Suite::ContextResultsRecorder> *)&this_local);
    rhs.tests_ = local_50.tests_;
    rhs.fixtures_ = local_50.fixtures_;
    rhs.checks_ = local_50.checks_;
    rhs.failedTests_ = local_50.failedTests_;
    rhs.failedChecks_ = local_50.failedChecks_;
    Impl_Results::Stats::operator+=(__return_storage_ptr__,rhs);
  }
  pCVar2 = Enhedron::Impl::Util::Out<Enhedron::Test::Impl::Impl_Suite::ContextResultsRecorder>::
           operator->((Out<Enhedron::Test::Impl::Impl_Suite::ContextResultsRecorder> *)&this_local);
  ContextResultsRecorder::endGiven(pCVar2,__return_storage_ptr__,&this->name);
  return __return_storage_ptr__;
}

Assistant:

virtual Stats run(const PathList& pathList, Out<ContextResultsRecorder> results, size_t depth) override {
            results->beginGiven(name);
            Stats stats;

            if (included(pathList, depth)) {
                stats += args.applyExtraBefore(runTest, name, results);
            }

            results->endGiven(stats, name);

            return stats;
        }